

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O2

void absl::base_internal::ThrowStdOverflowError(char *what_arg)

{
  raw_log_internal::RawLog(kFatal,"throw_delegate.cc",0xa3,"%s",what_arg);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/base/internal/throw_delegate.cc"
                ,0xa3,"void absl::base_internal::ThrowStdOverflowError(const char *)");
}

Assistant:

void ThrowStdOverflowError(const char* what_arg) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw std::overflow_error(what_arg);
#else
  ABSL_RAW_LOG(FATAL, "%s", what_arg);
  std::abort();
#endif
}